

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_ReadBinaryFile::test_method(util_ReadBinaryFile *this)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  string *psVar5;
  long in_FS_OFFSET;
  bool bVar6;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar8;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  assertion_result local_438;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 local_340 [8];
  string local_338 [8];
  undefined1 *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  path local_318;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e0;
  ofstream file;
  string local_2c8 [504];
  string expected_text;
  path local_b0;
  path tmpfile;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  fs::operator/(&tmpfile,(path *)&local_b0,"read_binary.dat");
  std::filesystem::__cxx11::path::~path(&local_b0);
  expected_text._M_dataplus._M_p = (pointer)&expected_text.field_2;
  expected_text._M_string_length = 0;
  expected_text.field_2._M_local_buf[0] = '\0';
  iVar2 = 0x1e;
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&expected_text,"0123456789");
  }
  std::ofstream::ofstream(&file,tmpfile.super_path._M_pathname._M_dataplus._M_p,_S_out);
  psVar7 = &expected_text;
  std::operator<<((ostream *)&file,(string *)psVar7);
  std::ofstream::~ofstream(&file);
  ReadBinaryFile_abi_cxx11_
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file,&tmpfile,0xffffffffffffffff);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6f4;
  file_00.m_begin = (iterator)&local_350;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_360,msg);
  local_2f0._8_8_ = (element_type *)0x0;
  aStack_2e0._M_allocated_capacity = 0;
  local_438._0_8_ = "valid";
  local_438.m_message.px = (element_type *)0xc85c24;
  local_338[0] = (string)0x0;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_368 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_328._M_allocated_capacity = (size_type)&local_438;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f0,(lazy_ostream *)local_340,1,0,WARN,_cVar8,
             (size_t)&local_370,0x6f4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e0._M_allocated_capacity);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x6f5;
  file_01.m_begin = (iterator)&local_380;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_390,
             msg_00);
  local_338[0] = (string)0x0;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_398 = "";
  pvVar3 = (iterator)0x2;
  psVar5 = local_2c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_340,&local_3a0,0x6f5,1,2,local_2c8,"text",psVar7,"expected_text");
  std::__cxx11::string::~string(local_2c8);
  ReadBinaryFile_abi_cxx11_
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file,&tmpfile,expected_text._M_string_length >> 1);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x6fa;
  file_02.m_begin = (iterator)&local_3b0;
  msg_01.m_end = (iterator)psVar5;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3c0,
             msg_01);
  local_2f0[0] = file;
  local_2f0._8_8_ = (element_type *)0x0;
  aStack_2e0._M_allocated_capacity = 0;
  local_438._0_8_ = "valid";
  local_438.m_message.px = (element_type *)0xc85c24;
  local_338[0] = (string)0x0;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3c8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_328._M_allocated_capacity = (size_type)&local_438;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2f0,(lazy_ostream *)local_340,1,0,WARN,(check_type)psVar7,
             (size_t)&local_3d0,0x6fa);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_2e0._M_allocated_capacity);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x6fb;
  file_03.m_begin = (iterator)&local_3e0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3f0,
             msg_02);
  local_338[0] = (string)0x0;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_011480b0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f8 = "";
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (__return_storage_ptr__,&expected_text,0,expected_text._M_string_length >> 1);
  pvVar3 = (iterator)0x2;
  psVar5 = local_2c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_340,&local_400,0x6fb,1,2,local_2c8,"text",__return_storage_ptr__,
             "expected_text.substr(0, expected_text.size() / 2)");
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string(local_2c8);
  std::filesystem::__cxx11::path::path(&local_318,&tmpfolder.super_path);
  fs::operator/((path *)&file,(path *)&local_318,"invalid_binary.dat");
  std::filesystem::__cxx11::path::~path(&local_318);
  ReadBinaryFile_abi_cxx11_
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_340,(path *)&file,0xffffffffffffffff);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x701;
  file_04.m_begin = (iterator)&local_410;
  msg_03.m_end = (iterator)psVar5;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_420,
             msg_03);
  local_438._0_8_ = CONCAT71(local_438._1_7_,local_340[0]) ^ 1;
  local_438.m_message.px = (element_type *)0x0;
  local_438.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_448 = "!valid";
  local_440 = "";
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_450 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  aStack_2e0._8_8_ = &local_448;
  boost::test_tools::tt_detail::report_assertion
            (&local_438,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)__return_storage_ptr__,
             (size_t)&local_458,0x701);
  boost::detail::shared_count::~shared_count(&local_438.m_message.pn);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x702;
  file_05.m_begin = (iterator)&local_468;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_478,
             msg_04);
  local_438.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_330 == (undefined1 *)0x0);
  local_438.m_message.px = (element_type *)0x0;
  local_438.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_448 = "text.empty()";
  local_440 = "";
  local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
  local_2f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_2e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_480 = "";
  aStack_2e0._8_8_ = &local_448;
  boost::test_tools::tt_detail::report_assertion
            (&local_438,(lazy_ostream *)local_2f0,1,0,WARN,(check_type)__return_storage_ptr__,
             (size_t)&local_488,0x702);
  boost::detail::shared_count::~shared_count(&local_438.m_message.pn);
  std::__cxx11::string::~string(local_338);
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::__cxx11::string::~string((string *)&expected_text);
  std::filesystem::__cxx11::path::~path(&tmpfile.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadBinaryFile)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    fs::path tmpfile = tmpfolder / "read_binary.dat";
    std::string expected_text;
    for (int i = 0; i < 30; i++) {
        expected_text += "0123456789";
    }
    {
        std::ofstream file{tmpfile};
        file << expected_text;
    }
    {
        // read all contents in file
        auto [valid, text] = ReadBinaryFile(tmpfile);
        BOOST_CHECK(valid);
        BOOST_CHECK_EQUAL(text, expected_text);
    }
    {
        // read half contents in file
        auto [valid, text] = ReadBinaryFile(tmpfile, expected_text.size() / 2);
        BOOST_CHECK(valid);
        BOOST_CHECK_EQUAL(text, expected_text.substr(0, expected_text.size() / 2));
    }
    {
        // read from non-existent file
        fs::path invalid_file = tmpfolder / "invalid_binary.dat";
        auto [valid, text] = ReadBinaryFile(invalid_file);
        BOOST_CHECK(!valid);
        BOOST_CHECK(text.empty());
    }
}